

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

int macro_install(void)

{
  int iVar1;
  bool bVar2;
  int local_18;
  uint local_14;
  int i;
  int hash;
  char c;
  
  local_14 = 0;
  lablptr->type = 5;
  for (local_18 = 1; local_18 <= symbol[0]; local_18 = local_18 + 1) {
    iVar1 = (int)symbol[local_18] + local_14;
    local_14 = iVar1 * 8 + (iVar1 >> 5) + (int)symbol[local_18];
  }
  mptr = (t_macro *)malloc(0x50);
  bVar2 = mptr != (t_macro *)0x0;
  if (bVar2) {
    strcpy(mptr->name,symbol + 1);
    mptr->line = (t_line *)0x0;
    mptr->next = macro_tbl[(int)(local_14 & 0xff)];
    macro_tbl[(int)(local_14 & 0xff)] = mptr;
    mlptr = (t_line *)0x0;
  }
  else {
    error("Out of memory!");
  }
  hash = (int)bVar2;
  return hash;
}

Assistant:

int
macro_install(void)
{
	char c;
	int hash = 0;
	int i;

	/* mark the macro name as reserved */
	lablptr->type = MACRO;

	/* check macro name syntax */
	/*
	if (strchr(&symbol[1], '.')) {
		error("Invalid macro name!");
		return (0);
	}
	*/

	/* calculate symbol hash value */
	for (i = 1; i <= symbol[0]; i++) {
		c = symbol[i];
		hash += c;
		hash  = (hash << 3) + (hash >> 5) + c;
	}
	hash &= 0xFF;

	/* allocate a macro struct */
	mptr = (void *)malloc(sizeof(struct t_macro));
	if (mptr == NULL) {
		error("Out of memory!");
		return (0);
	}

	/* initialize it */
	strcpy(mptr->name, &symbol[1]);
	mptr->line = NULL;
	mptr->next = macro_tbl[hash];
	macro_tbl[hash] = mptr;
	mlptr = NULL;

	/* ok */
	return (1);
}